

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O0

void __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::Block<Eigen::Matrix<std::complex<double>,2,2,0,2,2>,2,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
::
copyCoeff<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
           *this,Index index,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          *other)

{
  ScalarWithConstIfNotLvalue *pSVar1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  *in_RDX;
  scalar_quotient_op<std::complex<double>,_std::complex<double>_> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Scalar *tmp;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  *_other;
  complex<double> *in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffffa8;
  MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>
  *in_stack_ffffffffffffffb0;
  
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
  ::const_cast_derived(in_RDX);
  pSVar1 = MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>
           ::coeffRef(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
  ::coeff((CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
           *)in_RDI,(Index)in_stack_ffffffffffffff98);
  internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>::operator()
            (in_RDI,in_stack_ffffffffffffff98,(complex<double> *)0x318e70);
  *(undefined8 *)pSVar1->_M_value = extraout_XMM0_Qa;
  *(undefined8 *)(pSVar1->_M_value + 8) = in_XMM1_Qa;
  return;
}

Assistant:

void copyCoeff(Index index, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(index >= 0 && index < m_matrix.size());
      Scalar& tmp = m_matrix.coeffRef(index);
      tmp = m_functor(tmp, _other.coeff(index));
    }